

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_masked_sprite_16px(tgestate_t *state,vischar_t *vischar)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  byte x;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  byte bVar19;
  byte *pbVar20;
  
  x = (byte)(vischar->isopos).x & 7;
  if (x < 4) {
    plot_masked_sprite_16px_right(state,x);
    return;
  }
  bVar9 = x - 4;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_right;
  lVar10 = 0;
  do {
    bVar7 = puVar2[lVar10 * 2];
    bVar11 = puVar2[lVar10 * 2 + 1];
    bVar15 = puVar3[lVar10 * 2];
    bVar19 = puVar3[lVar10 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar18 = (ulong)bVar7;
      uVar13 = (ulong)bVar15;
      bVar15 = state->reversed[bVar19];
      bVar19 = state->reversed[uVar13];
      bVar7 = state->reversed[bVar11];
      bVar11 = state->reversed[uVar18];
    }
    if (x == 4) {
      bVar16 = bVar19 * '\x02' + 1;
      bVar8 = bVar15 >> 7;
      bVar15 = bVar15 * '\x02' | bVar19 >> 7;
      bVar8 = bVar8 | 0xfe;
LAB_0010a983:
      bVar19 = bVar16 * '\x02' + 1;
      bVar16 = bVar15 * '\x02' | bVar16 >> 7;
      bVar8 = bVar8 * '\x02' | bVar15 >> 7;
      bVar5 = true;
LAB_0010a9a7:
      bVar6 = bVar5;
      bVar14 = bVar19 * '\x02' + 1;
      bVar15 = bVar16 * '\x02' | bVar19 >> 7;
      bVar8 = bVar8 * '\x02' | bVar16 >> 7;
      bVar5 = true;
LAB_0010a9cb:
      if (x == 4) {
        bVar16 = bVar7 >> 7;
        bVar7 = bVar7 * '\x02' | bVar11 >> 7;
        bVar11 = bVar11 * '\x02';
      }
      else {
        bVar16 = 0;
      }
      if (bVar6) {
        bVar16 = bVar16 * '\x02' | bVar7 >> 7;
        bVar7 = bVar7 * '\x02' | bVar11 >> 7;
        bVar11 = bVar11 * '\x02';
      }
      bVar12 = bVar7;
      bVar17 = bVar11;
      if (bVar5) {
        bVar17 = bVar11 * '\x02';
        bVar12 = bVar7 * '\x02' | bVar11 >> 7;
        bVar16 = bVar16 * '\x02' | bVar7 >> 7;
      }
      bVar19 = bVar14 * '\x02' + 1;
      bVar8 = bVar8 * '\x02' | bVar15 >> 7;
      bVar11 = bVar17 * '\x02';
      bVar7 = bVar12 * '\x02' | bVar17 >> 7;
      bVar17 = bVar16 * '\x02' | bVar12 >> 7;
      bVar15 = bVar15 * '\x02' | bVar14 >> 7;
    }
    else {
      bVar8 = 0xff;
      bVar16 = bVar19;
      if (bVar9 == 1) goto LAB_0010a983;
      bVar17 = 0;
      bVar6 = false;
      bVar16 = bVar15;
      bVar5 = false;
      if (bVar9 < 3) goto LAB_0010a9a7;
      bVar5 = false;
      bVar14 = bVar19;
      if (bVar9 == 3) goto LAB_0010a9cb;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar20 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_right_1 != '\0') {
      *pbVar20 = bVar17 & *pbVar4 | (bVar8 | ~*pbVar4) & *pbVar20;
    }
    if ((state->spriteplotter).enable_16_right_2 != '\0') {
      pbVar20[1] = bVar7 & pbVar4[1] | (bVar15 | ~pbVar4[1]) & pbVar20[1];
    }
    pbVar20 = pbVar20 + 2;
    if ((state->spriteplotter).enable_16_right_3 != '\0') {
      *pbVar20 = bVar11 & pbVar4[2] | (bVar19 | ~pbVar4[2]) & *pbVar20;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar20 + (long)state->columns + -2;
    lVar10 = lVar10 + 1;
    if (uVar1 == (uint8_t)lVar10) {
      return;
    }
  } while( true );
}

Assistant:

void plot_masked_sprite_16px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t x; /* was A */

  ASSERT_VISCHAR_VALID(vischar);

  x = vischar->isopos.x & 7;
  if (x < 4)
    plot_masked_sprite_16px_right(state, x); /* was fallthrough */
  else
    plot_masked_sprite_16px_left(state, x);
}